

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::Impl(Impl *this,string *dbname,string *fullpath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  KeyValueStore *pKVar3;
  FileKeyValueStore *pFVar4;
  MemoryKeyValueStore *pMVar5;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Head_base<0UL,_groundupdb::KeyValueStore_*,_false> local_a0;
  _Head_base<0UL,_groundupdb::KeyValueStore_*,_false> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  string *local_38;
  
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR__Impl_001d3bf0;
  local_48 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_48;
  pcVar2 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + dbname->_M_string_length);
  local_50 = &(this->m_fullpath).field_2;
  (this->m_fullpath)._M_dataplus._M_p = (pointer)local_50;
  pcVar2 = (fullpath->_M_dataplus)._M_p;
  local_38 = &this->m_name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_fullpath,pcVar2,pcVar2 + fullpath->_M_string_length);
  (this->m_keyValueStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)0x0;
  (this->m_indexStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)0x0;
  local_40 = &this->m_fullpath;
  pFVar4 = (FileKeyValueStore *)operator_new(0x10);
  paVar1 = &local_70.field_2;
  pcVar2 = (fullpath->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + fullpath->_M_string_length);
  FileKeyValueStore::FileKeyValueStore(pFVar4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_98._M_head_impl = (KeyValueStore *)pFVar4;
  pMVar5 = (MemoryKeyValueStore *)operator_new(0x10);
  MemoryKeyValueStore::MemoryKeyValueStore
            (pMVar5,(unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                     *)&local_98);
  pKVar3 = (this->m_keyValueStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  (this->m_keyValueStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)pMVar5;
  if (pKVar3 != (KeyValueStore *)0x0) {
    (*(pKVar3->super_Store)._vptr_Store[1])();
  }
  pcVar2 = (fullpath->_M_dataplus)._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + fullpath->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  pFVar4 = (FileKeyValueStore *)operator_new(0x10);
  if (local_90 == &local_80) {
    local_70.field_2._8_8_ = local_80._8_8_;
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)local_90;
  }
  local_70.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_70.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_70._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_90 = &local_80;
  FileKeyValueStore::FileKeyValueStore(pFVar4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_head_impl = (KeyValueStore *)pFVar4;
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0])
                             + 1);
  }
  pMVar5 = (MemoryKeyValueStore *)operator_new(0x10);
  MemoryKeyValueStore::MemoryKeyValueStore
            (pMVar5,(unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                     *)&local_a0);
  pKVar3 = (this->m_indexStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  (this->m_indexStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)pMVar5;
  if (pKVar3 != (KeyValueStore *)0x0) {
    (*(pKVar3->super_Store)._vptr_Store[1])();
  }
  if ((FileKeyValueStore *)local_a0._M_head_impl != (FileKeyValueStore *)0x0) {
    (*((Store *)&((local_a0._M_head_impl)->super_Store)._vptr_Store)->_vptr_Store[1])();
  }
  if ((FileKeyValueStore *)local_98._M_head_impl != (FileKeyValueStore *)0x0) {
    (*((Store *)&((local_98._M_head_impl)->super_Store)._vptr_Store)->_vptr_Store[1])();
  }
  return;
}

Assistant:

EmbeddedDatabase::Impl::Impl(std::string dbname, std::string fullpath)
  : m_name(dbname), m_fullpath(fullpath)
{
  // Explicitly specify base type so it matches the make_unique expected class (KeyValueStore)
  std::unique_ptr<KeyValueStore> fileStore = std::make_unique<FileKeyValueStore>(fullpath);
  std::unique_ptr<KeyValueStore> memoryStore = std::make_unique<MemoryKeyValueStore>(fileStore);
  m_keyValueStore = std::move(memoryStore);

  // Explicitly specify base type so it matches the make_unique expected class (KeyValueStore)
  std::unique_ptr<KeyValueStore> fileIndexStore = std::make_unique<FileKeyValueStore>(fullpath + "/.indexes");
  std::unique_ptr<KeyValueStore> memIndexStore = std::make_unique<MemoryKeyValueStore>(fileIndexStore);
  m_indexStore = std::move(memIndexStore);
}